

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::from_chars(c4 *this,csubstr buf,raw_wrapper *r)

{
  code *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  c4 *__src;
  undefined8 *puVar4;
  size_t space;
  void *vptr;
  char *local_30;
  c4 *local_28;
  
  puVar4 = (undefined8 *)buf.len;
  local_30 = buf.str;
  local_28 = this;
  __src = (c4 *)std::align(puVar4[2],puVar4[1],&local_28,(size_t *)&local_30);
  if (__src == (c4 *)0x0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return (bool)uVar3;
      }
    }
    handle_error(0x1e5106,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x4307,"ptr != nullptr");
  }
  if ((this <= __src) && (__src <= this + (long)buf.str)) {
    memcpy((void *)*puVar4,__src,puVar4[1]);
    return true;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar2 = is_debugger_attached();
    if (bVar2) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return (bool)uVar3;
    }
  }
  handle_error(0x1e5106,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x4308,"ptr >= buf.begin() && ptr <= buf.end()");
}

Assistant:

bool from_chars(csubstr buf, fmt::raw_wrapper *r)
{
    void * vptr = (void*)buf.str;
    size_t space = buf.len;
    auto ptr = (decltype(buf.str)) std::align(r->alignment, r->len, vptr, space);
    C4_CHECK(ptr != nullptr);
    C4_CHECK(ptr >= buf.begin() && ptr <= buf.end());
    //size_t dim = (ptr - buf.str) + r->len;
    memcpy(r->buf, ptr, r->len);
    return true;
}